

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_cluster.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_ambig(args_t *this,char *str)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"resolve");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x10) = 0;
  }
  else {
    iVar1 = strcmp(in_RSI,"average");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x10) = 1;
    }
    else {
      iVar1 = strcmp(in_RSI,"skip");
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDI + 0x10) = 2;
      }
      else {
        iVar1 = strcmp(in_RSI,"gapmm");
        if (iVar1 == 0) {
          *(undefined4 *)(in_RDI + 0x10) = 3;
        }
        else {
          *(undefined4 *)(in_RDI + 0x10) = 4;
          sVar2 = strlen(in_RSI);
          pvVar3 = operator_new__(sVar2 + 1);
          *(void **)(in_RDI + 0x30) = pvVar3;
          strcpy(*(char **)(in_RDI + 0x30),in_RSI);
        }
      }
    }
  }
  return;
}

Assistant:

void args_t::parse_ambig( const char * str ) {
        if (!strcmp (str, "resolve")) {
            ambig = resolve;
        } else if (!strcmp (str, "average")) {
            ambig = average;
        } else if (!strcmp (str, "skip")) {
            ambig = skip;
        } else if (!strcmp (str, "gapmm")) {
            ambig = gapmm;
        } else {
            ambig = subset;
            ambigs_to_resolve = new char [strlen (str) + 1];
            strcpy (ambigs_to_resolve, str);
        }
    }